

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_bin.h
# Opt level: O0

void cache_bin_finish_flush(cache_bin_t *bin,cache_bin_ptr_array_t *arr,cache_bin_sz_t nflushed)

{
  cache_bin_sz_t cVar1;
  ushort in_DX;
  cache_bin_t *in_RSI;
  long *in_RDI;
  uint rem;
  
  cVar1 = cache_bin_ncached_get_local(in_RSI);
  memmove((void *)(*in_RDI + (long)(int)(uint)in_DX * 8),(void *)*in_RDI,
          (ulong)((uint)cVar1 - (uint)in_DX) << 3);
  *in_RDI = *in_RDI + (long)(int)(uint)in_DX * 8;
  cache_bin_low_water_adjust(in_RSI);
  return;
}

Assistant:

static inline void
cache_bin_finish_flush(cache_bin_t *bin, cache_bin_ptr_array_t *arr,
    cache_bin_sz_t nflushed) {
	unsigned rem = cache_bin_ncached_get_local(bin) - nflushed;
	memmove(bin->stack_head + nflushed, bin->stack_head,
	    rem * sizeof(void *));
	bin->stack_head += nflushed;
	cache_bin_low_water_adjust(bin);
}